

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint8 *ip6Addr)

{
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  QHostAddressPrivate::setAddress((this->d).d.ptr,ip6Addr);
  return;
}

Assistant:

void QHostAddress::setAddress(const quint8 *ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}